

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined4 kernel_w;
  undefined4 kernel_h;
  float *pfVar9;
  void *pvVar10;
  int *piVar11;
  Allocator *pAVar12;
  int max_ii;
  bool bVar13;
  int k_5;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  undefined1 *puVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  uint inch;
  uint uVar25;
  void *pvVar26;
  short *psVar27;
  ulong uVar28;
  long lVar29;
  int k;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  int i;
  int iVar34;
  size_t _elemsize;
  long lVar35;
  long lVar36;
  int max_kk;
  uint uVar37;
  char *pcVar38;
  short *psVar39;
  undefined1 *puVar40;
  int m_1;
  uint uVar41;
  long lVar42;
  long lVar43;
  int i_00;
  int k_3;
  int iVar44;
  int k_00;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  undefined1 auVar49 [16];
  float fVar50;
  long local_1e0;
  long local_1d8;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int TILE_N;
  ulong local_198;
  Mat *local_190;
  short *local_188;
  uint local_17c;
  Mat m;
  long local_120;
  Mat local_118;
  ulong local_c8;
  int TILE_K;
  int TILE_M;
  long local_b8;
  undefined8 local_b0;
  int TILE_M_2;
  short asStack_a4 [2];
  undefined8 local_a0;
  undefined8 local_98;
  int local_90;
  short sStack_8a;
  Allocator *local_88;
  int local_80;
  int local_7c;
  int local_78;
  undefined8 local_74;
  size_t local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  kernel_w = (this->super_Convolution).kernel_w;
  kernel_h = (this->super_Convolution).kernel_h;
  auVar49._4_4_ = kernel_h;
  auVar49._0_4_ = kernel_w;
  uVar20 = kernel_h * kernel_w;
  uVar28 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar20;
  uVar21 = (this->super_Convolution).num_output;
  uVar22 = (ulong)(int)uVar21;
  uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) /
           (long)(int)uVar21;
  uVar31 = uVar28 & 0xffffffff;
  inch = (uint)uVar28;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar13 = false;
  }
  else {
    bVar13 = 8 < (int)uVar21 || 8 < (int)inch;
  }
  auVar2._0_4_ = (this->super_Convolution).dilation_w;
  auVar2._4_4_ = (this->super_Convolution).dilation_h;
  auVar2._8_4_ = (this->super_Convolution).stride_w;
  auVar2._12_4_ = (this->super_Convolution).stride_h;
  auVar49._8_8_ = 0;
  auVar49 = vpunpcklqdq_avx(auVar49,auVar2);
  local_190 = &(this->super_Convolution).weight_data;
  lVar23 = (long)(int)inch;
  if ((((auVar49 == _DAT_00539080) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar13)))) {
    bVar13 = opt->use_winograd43_convolution;
    iVar14 = cpu_support_x86_avx2();
    if (bVar13 == true) {
      if (iVar14 != 0) {
        conv3x3s1_winograd43_transform_kernel_int8_avx2
                  (local_190,&this->weight_winograd43_data,inch,uVar21,opt);
        goto LAB_001e82ce;
      }
      uVar31 = 0;
      get_optimal_tile_mnk_int8(uVar21,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar28 = (long)(int)(uVar21 + TILE_M + -1) / (long)TILE_M;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      Mat::create(&local_118,TILE_K * TILE_M * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      iVar14 = (int)uVar28;
      Mat::create(&this->weight_winograd43_data,TILE_K * TILE_M,0x24,
                  (int)(inch + TILE_K + -1) / TILE_K,iVar14,4,(Allocator *)0x0);
      uVar28 = uVar28 & 0xffffffff;
      if (iVar14 < 1) {
        uVar28 = uVar31;
      }
      for (; uVar31 != uVar28; uVar31 = uVar31 + 1) {
        iVar14 = get_omp_thread_num();
        local_188 = (short *)((long)iVar14 * local_118.cstep * local_118.elemsize +
                             (long)local_118.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_118.elemsize;
        m.elempack = local_118.elempack;
        m.allocator = local_118.allocator;
        m.w = local_118.w;
        m.d = 1;
        m.h = local_118.h;
        m.c = local_118.d;
        m.dims = local_118.dims + -1;
        m.cstep = (local_118.elemsize * (long)local_118.h * (long)local_118.w + 0xf &
                  0xfffffffffffffff0) / local_118.elemsize;
        if (local_118.dims == 4) {
          m.cstep = (long)local_118.h * (long)local_118.w;
        }
        iVar14 = (int)uVar31 * TILE_M;
        uVar20 = uVar21 - iVar14;
        if (TILE_M < (int)uVar20) {
          uVar20 = TILE_M;
        }
        local_198 = CONCAT44(local_198._4_4_,uVar20);
        uVar22 = 0;
        if (0 < (int)uVar20) {
          uVar22 = (ulong)uVar20;
        }
        m.data = local_188;
        for (uVar30 = 0; (long)uVar30 < lVar23; uVar30 = uVar30 + (long)TILE_K) {
          uVar20 = inch - (int)uVar30;
          if (TILE_K < (int)uVar20) {
            uVar20 = TILE_K;
          }
          uVar17 = 0;
          if (0 < (int)uVar20) {
            uVar17 = (ulong)uVar20;
          }
          psVar39 = local_188;
          for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
            pvVar26 = local_190->data;
            for (uVar32 = 0; uVar32 != uVar17; uVar32 = uVar32 + 1) {
              pcVar38 = (char *)((long)pvVar26 +
                                (uVar32 + uVar30) * 9 +
                                (long)(int)((iVar14 + (int)uVar24) * inch * 9));
              for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
                cVar3 = *pcVar38;
                cVar4 = pcVar38[1];
                cVar5 = pcVar38[2];
                asStack_a4[lVar42 + -2] = cVar3 * 6;
                asStack_a4[lVar42 + 1] = -(cVar5 * 4 + cVar4 * 4 + cVar3 * 4);
                *(short *)((long)&local_a0 + lVar42 * 2 + 4) = cVar4 * 4 + cVar3 * -4 + cVar5 * -4;
                *(short *)((long)&local_98 + lVar42 * 2 + 2) = (short)cVar3 + cVar4 * 2 + cVar5 * 4;
                *(short *)((long)&local_90 + lVar42 * 2) =
                     ((short)cVar3 - ((short)cVar4 + (short)cVar4)) + cVar5 * 4;
                (&sStack_8a)[lVar42] = cVar5 * 6;
                pcVar38 = pcVar38 + 3;
              }
              for (lVar42 = 0; lVar42 != 0x24; lVar42 = lVar42 + 6) {
                sVar6 = *(short *)((long)asStack_a4 + lVar42 + -4);
                sVar7 = *(short *)((long)asStack_a4 + lVar42 + -2);
                sVar8 = *(short *)((long)asStack_a4 + lVar42);
                *psVar39 = sVar6 * 6;
                psVar39[1] = -(sVar8 * 4 + sVar7 * 4 + sVar6 * 4);
                psVar39[2] = sVar7 * 4 + sVar6 * -4 + sVar8 * -4;
                psVar39[3] = sVar6 + sVar7 * 2 + sVar8 * 4;
                psVar39[4] = sVar6 + sVar7 * -2 + sVar8 * 4;
                psVar39[5] = sVar8 * 6;
                psVar39 = psVar39 + 6;
              }
            }
          }
          local_7c = (this->weight_winograd43_data).w;
          local_78 = (this->weight_winograd43_data).h;
          local_98 = (this->weight_winograd43_data).elemsize;
          local_90 = (this->weight_winograd43_data).elempack;
          local_88 = (this->weight_winograd43_data).allocator;
          local_68 = (long)local_78 * (long)local_7c;
          _TILE_M_2 = (void *)((long)(this->weight_winograd43_data).data +
                              local_98 * local_68 *
                              (long)(int)((long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 |
                                                uVar30 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd43_data).cstep * uVar31 * local_98);
          local_a0 = (int *)0x0;
          local_80 = 2;
          local_74._0_4_ = 1;
          local_74._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x24,(int)local_198,uVar20);
        }
      }
      piVar11 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar11 == (int *)0x0) goto LAB_001e82ce;
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) goto LAB_001e82ce;
      if (local_118.allocator != (Allocator *)0x0) {
        (*(local_118.allocator)->_vptr_Allocator[3])();
        goto LAB_001e82ce;
      }
    }
    else {
      if (iVar14 != 0) {
        conv3x3s1_winograd23_transform_kernel_int8_avx2
                  (local_190,&this->weight_winograd23_data,inch,uVar21,opt);
        goto LAB_001e82ce;
      }
      get_optimal_tile_mnk_int8(uVar21,0,inch,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar28 = (long)(int)(uVar21 + TILE_M + -1) / (long)TILE_M;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      Mat::create(&local_118,TILE_K * TILE_M * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      iVar14 = (int)uVar28;
      Mat::create(&this->weight_winograd23_data,TILE_K * TILE_M,0x10,
                  (int)(inch + TILE_K + -1) / TILE_K,iVar14,2,(Allocator *)0x0);
      local_198 = uVar28 & 0xffffffff;
      if (iVar14 < 1) {
        local_198 = 0;
      }
      for (uVar28 = 0; uVar28 != local_198; uVar28 = uVar28 + 1) {
        iVar14 = get_omp_thread_num();
        psVar39 = (short *)((long)iVar14 * local_118.cstep * local_118.elemsize +
                           (long)local_118.data);
        m.refcount = (int *)0x0;
        m.elemsize = local_118.elemsize;
        m.elempack = local_118.elempack;
        m.allocator = local_118.allocator;
        m.w = local_118.w;
        m.d = 1;
        m.h = local_118.h;
        m.c = local_118.d;
        m.dims = local_118.dims + -1;
        m.cstep = (local_118.elemsize * (long)local_118.h * (long)local_118.w + 0xf &
                  0xfffffffffffffff0) / local_118.elemsize;
        if (local_118.dims == 4) {
          m.cstep = (long)local_118.h * (long)local_118.w;
        }
        iVar14 = (int)uVar28 * TILE_M;
        uVar20 = uVar21 - iVar14;
        if (TILE_M < (int)uVar20) {
          uVar20 = TILE_M;
        }
        local_188 = (short *)CONCAT44(local_188._4_4_,uVar20);
        uVar31 = 0;
        if (0 < (int)uVar20) {
          uVar31 = (ulong)uVar20;
        }
        m.data = psVar39;
        for (uVar22 = 0; (long)uVar22 < lVar23; uVar22 = uVar22 + (long)TILE_K) {
          uVar20 = inch - (int)uVar22;
          if (TILE_K < (int)uVar20) {
            uVar20 = TILE_K;
          }
          uVar30 = 0;
          if (0 < (int)uVar20) {
            uVar30 = (ulong)uVar20;
          }
          psVar27 = psVar39;
          for (uVar17 = 0; uVar17 != uVar31; uVar17 = uVar17 + 1) {
            pvVar26 = local_190->data;
            for (uVar24 = 0; uVar24 != uVar30; uVar24 = uVar24 + 1) {
              pcVar38 = (char *)((long)pvVar26 +
                                (uVar24 + uVar22) * 9 +
                                (long)(int)((iVar14 + (int)uVar17) * inch * 9));
              for (lVar42 = 0; lVar19 = 4, lVar42 != 3; lVar42 = lVar42 + 1) {
                cVar3 = *pcVar38;
                cVar4 = pcVar38[1];
                cVar5 = pcVar38[2];
                asStack_a4[lVar42 + -2] = cVar3 * 2;
                asStack_a4[lVar42 + 1] = (short)cVar4 + (short)cVar3 + (short)cVar5;
                *(short *)((long)&local_a0 + lVar42 * 2 + 4) =
                     ((short)cVar3 - (short)cVar4) + (short)cVar5;
                *(short *)((long)&local_98 + lVar42 * 2 + 2) = (short)cVar5 + (short)cVar5;
                pcVar38 = pcVar38 + 3;
              }
              for (; lVar19 != 0x1c; lVar19 = lVar19 + 6) {
                sVar6 = *(short *)((long)&local_b0 + lVar19 + 4);
                sVar7 = *(short *)((long)&local_b0 + lVar19 + 6);
                sVar8 = *(short *)((long)asStack_a4 + lVar19 + -4);
                *psVar27 = sVar6 * 2;
                psVar27[1] = sVar7 + sVar6 + sVar8;
                psVar27[2] = (sVar6 - sVar7) + sVar8;
                psVar27[3] = sVar8 * 2;
                psVar27 = psVar27 + 4;
              }
            }
          }
          local_7c = (this->weight_winograd23_data).w;
          local_78 = (this->weight_winograd23_data).h;
          local_98 = (this->weight_winograd23_data).elemsize;
          local_90 = (this->weight_winograd23_data).elempack;
          local_88 = (this->weight_winograd23_data).allocator;
          local_68 = (long)local_78 * (long)local_7c;
          _TILE_M_2 = (void *)((long)(this->weight_winograd23_data).data +
                              local_98 * local_68 *
                              (long)(int)((long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 |
                                                uVar22 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd23_data).cstep * uVar28 * local_98);
          local_a0 = (int *)0x0;
          local_80 = 2;
          local_74._0_4_ = 1;
          local_74._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x10,(int)local_188,uVar20);
        }
      }
      piVar11 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar11 == (int *)0x0) goto LAB_001e82ce;
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) goto LAB_001e82ce;
      if (local_118.allocator != (Allocator *)0x0) {
        (*(local_118.allocator)->_vptr_Allocator[3])();
        goto LAB_001e82ce;
      }
    }
  }
  else {
    if (opt->use_sgemm_convolution != true) {
      iVar14 = cpu_support_x86_avx2();
      if (iVar14 == 0) {
        uVar25 = inch;
        if ((int)uVar21 < 4) {
          if ((int)uVar21 < 2) {
            if ((int)inch < 8) {
              if ((int)inch < 2) {
                _elemsize = 1;
                iVar14 = 1;
              }
              else {
                _elemsize = 2;
                iVar14 = 2;
                uVar25 = inch - (int)(uVar31 >> 1);
              }
            }
            else {
              _elemsize = 8;
              iVar14 = 8;
              uVar25 = (inch & 1) + (int)(uVar31 >> 3) + ((uint)(uVar31 >> 1) & 3);
            }
          }
          else if ((int)inch < 8) {
            if ((int)inch < 2) {
              uVar21 = (uVar21 & 1) + 1;
              _elemsize = 2;
              iVar14 = 2;
            }
            else {
              uVar25 = inch - (int)(uVar31 >> 1);
              uVar21 = (uVar21 & 1) + 1;
              _elemsize = 4;
              iVar14 = 4;
            }
          }
          else {
            uVar25 = (inch & 1) + (int)(uVar31 >> 3) + ((uint)(uVar31 >> 1) & 3);
            uVar21 = (uVar21 & 1) + 1;
            _elemsize = 0x10;
            iVar14 = 0x10;
          }
        }
        else if ((int)inch < 8) {
          if ((int)inch < 2) {
            uVar21 = (uVar21 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff) +
                     (uint)((uVar21 >> 1 & 1) != 0);
            _elemsize = 4;
            iVar14 = 4;
          }
          else {
            uVar25 = inch - (int)(uVar31 >> 1);
            uVar21 = (uVar21 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff) +
                     (uint)((uVar21 >> 1 & 1) != 0);
            _elemsize = 8;
            iVar14 = 8;
          }
        }
        else {
          uVar25 = (inch & 1) + (int)(uVar31 >> 3) + ((uint)(uVar31 >> 1) & 3);
          uVar21 = (uVar21 & 1) + ((uint)(uVar22 >> 2) & 0x3fffffff) +
                   (uint)((uVar21 >> 1 & 1) != 0);
          _elemsize = 0x20;
          iVar14 = 0x20;
        }
        Mat::create(&this->weight_data_tm,uVar20,uVar25,uVar21,_elemsize,iVar14,(Allocator *)0x0);
        uVar21 = inch * uVar20;
        local_48 = (ulong)uVar21;
        local_50 = (long)(int)uVar20;
        lVar23 = (long)(int)(uVar20 * 2);
        local_188 = (short *)(long)(int)(uVar20 * 8);
        local_c8 = 0;
        uVar28 = 0;
        if (0 < (int)uVar20) {
          uVar28 = (ulong)uVar20;
        }
        uVar16 = uVar21 * 4;
        local_38 = (ulong)uVar16;
        iVar14 = uVar21 * 3;
        iVar44 = uVar21 * 2;
        uVar31 = 0;
        uVar25 = uVar21;
        while (uVar37 = uVar25, uVar30 = uVar31, (long)(uVar30 | 3) < (long)uVar22) {
          local_60 = (long)iVar14;
          iVar34 = (int)local_c8;
          pvVar26 = (this->super_Convolution).weight_data.data;
          uVar41 = (uint)uVar30;
          local_120 = (long)(int)((uVar41 | 1) * uVar21) + (long)pvVar26;
          local_b0 = (long)(int)((uVar41 | 2) * uVar21) + (long)pvVar26;
          local_b8 = (long)(int)((int)(uVar30 | 3) * uVar21) + (long)pvVar26;
          lVar42 = (long)pvVar26 + local_60 + local_50;
          lVar19 = (long)pvVar26 + iVar44 + local_50;
          lVar45 = (long)pvVar26 + (int)uVar37 + local_50;
          lVar29 = (long)pvVar26 + iVar34 + local_50;
          puVar40 = (undefined1 *)
                    ((uVar30 >> 2) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize
                    + (long)(this->weight_data_tm).data);
          lVar36 = 0;
          uVar31 = (long)(int)(uVar21 * uVar41) + (long)pvVar26;
          local_1e0 = lVar29;
          local_1d8 = lVar42;
          local_1c0 = lVar19;
          local_1b8 = lVar45;
          for (uVar25 = 0; uVar17 = uVar31, (int)(uVar25 | 7) < (int)inch; uVar25 = uVar25 + 8) {
            lVar35 = lVar36;
            for (uVar31 = 0; uVar31 != uVar28; uVar31 = uVar31 + 1) {
              lVar43 = lVar35;
              for (lVar33 = 0; (int)lVar33 != 0x20; lVar33 = lVar33 + 8) {
                puVar40[lVar33] = *(undefined1 *)((long)pvVar26 + lVar43 + iVar34);
                puVar40[lVar33 + 1] = *(undefined1 *)(lVar29 + lVar43);
                puVar40[lVar33 + 2] = *(undefined1 *)((long)pvVar26 + lVar43 + (int)uVar37);
                puVar40[lVar33 + 3] = *(undefined1 *)(lVar45 + lVar43);
                puVar40[lVar33 + 4] = *(undefined1 *)((long)pvVar26 + lVar43 + iVar44);
                puVar40[lVar33 + 5] = *(undefined1 *)(lVar19 + lVar43);
                puVar40[lVar33 + 6] = *(undefined1 *)((long)pvVar26 + lVar43 + local_60);
                puVar40[lVar33 + 7] = *(undefined1 *)(lVar42 + lVar43);
                lVar43 = lVar43 + lVar23;
              }
              lVar35 = lVar35 + 1;
              puVar40 = puVar40 + lVar33;
            }
            local_120 = local_120 + (long)local_188;
            local_b0 = local_b0 + (long)local_188;
            local_b8 = local_b8 + (long)local_188;
            lVar36 = lVar36 + (long)local_188;
            local_1d8 = local_1d8 + (long)local_188;
            local_1c0 = local_1c0 + (long)local_188;
            local_1b8 = local_1b8 + (long)local_188;
            local_1e0 = local_1e0 + (long)local_188;
            uVar31 = uVar17 + (long)local_188;
            local_198 = uVar17;
          }
          for (; (int)(uVar25 | 1) < (int)inch; uVar25 = uVar25 + 2) {
            puVar18 = puVar40;
            for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
              puVar40[uVar31 * 8] = *(undefined1 *)(uVar17 + uVar31);
              puVar40[uVar31 * 8 + 1] = *(undefined1 *)(local_1e0 + uVar31);
              puVar40[uVar31 * 8 + 2] = *(undefined1 *)(local_120 + uVar31);
              puVar40[uVar31 * 8 + 3] = *(undefined1 *)(local_1b8 + uVar31);
              puVar40[uVar31 * 8 + 4] = *(undefined1 *)(local_b0 + uVar31);
              puVar40[uVar31 * 8 + 5] = *(undefined1 *)(local_1c0 + uVar31);
              puVar40[uVar31 * 8 + 6] = *(undefined1 *)(local_b8 + uVar31);
              puVar40[uVar31 * 8 + 7] = *(undefined1 *)(local_1d8 + uVar31);
              puVar18 = puVar18 + 8;
            }
            uVar17 = uVar17 + lVar23;
            local_120 = local_120 + lVar23;
            local_b0 = local_b0 + lVar23;
            local_b8 = local_b8 + lVar23;
            local_1d8 = local_1d8 + lVar23;
            local_1c0 = local_1c0 + lVar23;
            local_1b8 = local_1b8 + lVar23;
            local_1e0 = local_1e0 + lVar23;
            puVar40 = puVar18;
          }
          for (; (int)uVar25 < (int)inch; uVar25 = uVar25 + 1) {
            for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
              *puVar40 = *(undefined1 *)(uVar17 + uVar31);
              puVar40[1] = *(undefined1 *)(local_120 + uVar31);
              puVar40[2] = *(undefined1 *)(local_b0 + uVar31);
              puVar40[3] = *(undefined1 *)(local_b8 + uVar31);
              puVar40 = puVar40 + 4;
            }
          }
          local_c8 = (ulong)(iVar34 + uVar16);
          iVar14 = iVar14 + uVar16;
          iVar44 = iVar44 + uVar16;
          uVar25 = uVar37 + uVar16;
          local_17c = uVar37;
          local_40 = uVar30;
          uVar31 = uVar30 + 4;
        }
        local_b0 = (long)(int)(uVar20 * 5);
        local_b8 = (long)(int)(uVar20 * 6);
        local_58 = (long)(int)(uVar20 * 7);
        iVar14 = uVar20 * inch * 2;
        local_60 = CONCAT44(local_60._4_4_,iVar14);
        while (uVar25 = uVar37, uVar17 = uVar30, uVar31 = local_c8,
              (long)(uVar17 | 1) < (long)uVar22) {
          pvVar26 = (this->super_Convolution).weight_data.data;
          lVar19 = (long)(int)(uVar21 * (uint)uVar17) + (long)pvVar26;
          lVar43 = (long)(int)((int)(uVar17 | 1) * uVar21) + (long)pvVar26;
          lVar45 = (long)(int)uVar25;
          local_1e0 = (long)pvVar26 + lVar45 + local_58;
          local_1b8 = (long)pvVar26 + lVar45 + local_b8;
          local_1c0 = (long)pvVar26 + lVar45 + local_b0;
          local_1d8 = (long)pvVar26 + lVar45 + (int)(uVar20 * 4);
          local_1c8 = (long)pvVar26 + lVar45 + (int)(uVar20 * 3);
          lVar42 = (long)pvVar26 + lVar45 + lVar23;
          lVar46 = (long)pvVar26 + lVar45 + local_50;
          lVar45 = (long)(int)local_c8;
          lVar36 = (long)pvVar26 + lVar45 + local_58;
          lVar47 = (long)pvVar26 + lVar45 + local_b8;
          lVar29 = (long)pvVar26 + lVar45 + local_b0;
          lVar48 = (long)pvVar26 + lVar45 + (int)(uVar20 * 4);
          lVar33 = (long)pvVar26 + lVar45 + (int)(uVar20 * 3);
          lVar35 = (long)pvVar26 + lVar45 + lVar23;
          lVar45 = (long)pvVar26 + lVar45 + local_50;
          puVar40 = (undefined1 *)
                    ((ulong)(((uint)(uVar17 >> 2) & 0x3fffffff) +
                            (uint)(((uint)uVar17 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          uVar16 = 0;
          while( true ) {
            local_198 = CONCAT44(local_198._4_4_,uVar16);
            if ((int)inch <= (int)(uVar16 | 7)) break;
            for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
              *puVar40 = *(undefined1 *)(lVar19 + uVar31);
              puVar40[1] = *(undefined1 *)(lVar45 + uVar31);
              puVar40[2] = *(undefined1 *)(lVar35 + uVar31);
              puVar40[3] = *(undefined1 *)(lVar33 + uVar31);
              puVar40[4] = *(undefined1 *)(lVar48 + uVar31);
              puVar40[5] = *(undefined1 *)(lVar29 + uVar31);
              puVar40[6] = *(undefined1 *)(lVar47 + uVar31);
              puVar40[7] = *(undefined1 *)(lVar36 + uVar31);
              puVar40[8] = *(undefined1 *)(lVar43 + uVar31);
              puVar40[9] = *(undefined1 *)(lVar46 + uVar31);
              puVar40[10] = *(undefined1 *)(lVar42 + uVar31);
              puVar40[0xb] = *(undefined1 *)(local_1c8 + uVar31);
              puVar40[0xc] = *(undefined1 *)(local_1d8 + uVar31);
              puVar40[0xd] = *(undefined1 *)(local_1c0 + uVar31);
              puVar40[0xe] = *(undefined1 *)(local_1b8 + uVar31);
              puVar40[0xf] = *(undefined1 *)(local_1e0 + uVar31);
              puVar40 = puVar40 + 0x10;
            }
            lVar19 = lVar19 + (long)local_188;
            lVar43 = lVar43 + (long)local_188;
            uVar16 = uVar16 + 8;
            local_1e0 = local_1e0 + (long)local_188;
            local_1b8 = local_1b8 + (long)local_188;
            local_1c0 = local_1c0 + (long)local_188;
            local_1d8 = local_1d8 + (long)local_188;
            local_1c8 = local_1c8 + (long)local_188;
            lVar42 = lVar42 + (long)local_188;
            lVar46 = lVar46 + (long)local_188;
            lVar36 = lVar36 + (long)local_188;
            lVar47 = lVar47 + (long)local_188;
            lVar29 = lVar29 + (long)local_188;
            lVar48 = lVar48 + (long)local_188;
            lVar33 = lVar33 + (long)local_188;
            lVar35 = lVar35 + (long)local_188;
            lVar45 = lVar45 + (long)local_188;
          }
          for (; (int)(uVar16 | 1) < (int)inch; uVar16 = uVar16 + 2) {
            puVar18 = puVar40;
            for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
              puVar40[uVar31 * 4] = *(undefined1 *)(lVar19 + uVar31);
              puVar40[uVar31 * 4 + 1] = *(undefined1 *)(lVar43 + uVar31);
              puVar40[uVar31 * 4 + 2] = *(undefined1 *)(lVar45 + uVar31);
              puVar40[uVar31 * 4 + 3] = *(undefined1 *)(lVar46 + uVar31);
              puVar18 = puVar18 + 4;
            }
            lVar19 = lVar19 + lVar23;
            lVar43 = lVar43 + lVar23;
            lVar46 = lVar46 + lVar23;
            lVar45 = lVar45 + lVar23;
            puVar40 = puVar18;
          }
          for (; (int)uVar16 < (int)inch; uVar16 = uVar16 + 1) {
            for (uVar31 = 0; uVar28 != uVar31; uVar31 = uVar31 + 1) {
              *puVar40 = *(undefined1 *)(lVar19 + uVar31);
              puVar40[1] = *(undefined1 *)(lVar43 + uVar31);
              puVar40 = puVar40 + 2;
            }
          }
          local_c8 = (ulong)(uint)((int)local_c8 + iVar14);
          uVar37 = uVar25 + iVar14;
          local_17c = uVar25;
          local_40 = uVar17;
          uVar30 = uVar17 + 2;
        }
        for (; (long)uVar17 < (long)uVar22; uVar17 = uVar17 + 1) {
          pvVar26 = (this->super_Convolution).weight_data.data;
          uVar25 = (uint)uVar17;
          lVar42 = (long)(int)(uVar21 * uVar25) + (long)pvVar26;
          puVar40 = (undefined1 *)
                    ((ulong)((uVar25 & 1) + ((uint)(uVar17 >> 2) & 0x3fffffff) +
                            (uint)((uVar25 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          lVar19 = (int)uVar31 + local_50 + (long)pvVar26;
          for (uVar25 = 0; (int)(uVar25 | 7) < (int)inch; uVar25 = uVar25 + 8) {
            for (uVar30 = 0; uVar30 != uVar28; uVar30 = uVar30 + 1) {
              puVar18 = (undefined1 *)(lVar42 + uVar30);
              for (lVar45 = 0; (int)lVar45 != 8; lVar45 = lVar45 + 1) {
                puVar40[lVar45] = *puVar18;
                puVar18 = puVar18 + local_50;
              }
              puVar40 = puVar40 + lVar45;
            }
            lVar42 = lVar42 + (long)local_188;
            lVar19 = lVar19 + (long)local_188;
          }
          for (; (int)(uVar25 | 1) < (int)inch; uVar25 = uVar25 + 2) {
            for (uVar30 = 0; uVar28 != uVar30; uVar30 = uVar30 + 1) {
              *puVar40 = *(undefined1 *)(lVar42 + uVar30);
              puVar40[1] = *(undefined1 *)(lVar19 + uVar30);
              puVar40 = puVar40 + 2;
            }
            lVar42 = lVar42 + lVar23;
            lVar19 = lVar19 + lVar23;
          }
          for (; (int)uVar25 < (int)inch; uVar25 = uVar25 + 1) {
            for (uVar30 = 0; uVar28 != uVar30; uVar30 = uVar30 + 1) {
              puVar40[uVar30] = *(undefined1 *)(lVar42 + uVar30);
            }
            puVar40 = puVar40 + uVar30;
          }
          uVar31 = (ulong)((int)uVar31 + uVar20 * inch);
        }
      }
      else {
        convolution_transform_kernel_packed_int8_avx2
                  (local_190,&this->weight_data_tm,inch,uVar21,kernel_w,kernel_h);
      }
      goto LAB_001e82ce;
    }
    iVar44 = inch * uVar20;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar21,0,iVar44,&TILE_M_2,&TILE_M,&TILE_N,opt->num_threads);
    iVar14 = (int)(TILE_M_2 + uVar21 + -1) / TILE_M_2;
    uVar25 = 8;
    if (opt->use_packing_layout == false) {
      uVar25 = 1;
    }
    if ((uVar28 & 7) != 0) {
      uVar25 = 1;
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if (uVar20 == 1) {
      Mat::reshape(&m,local_190,iVar44,uVar21,(Allocator *)0x0);
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + 1;
        UNLOCK();
      }
      piVar11 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            free(local_118.data);
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.data = m.data;
      local_118.refcount._0_4_ = SUB84(m.refcount,0);
      local_118.refcount._4_4_ = (undefined4)((ulong)m.refcount >> 0x20);
      local_118.elemsize = m.elemsize;
      local_118.elempack = m.elempack;
      local_118.allocator = m.allocator;
      local_118.dims = m.dims;
      local_118.w = m.w;
      local_118.h = m.h;
      local_118.d = m.d;
      local_118.c = m.c;
      local_118.cstep = m.cstep;
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
LAB_001e8048:
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&m,local_190,uVar20,inch,uVar21,(Allocator *)0x0);
      uVar31 = 0;
      Mat::create(&local_118,iVar44,uVar21,1,1,(Allocator *)0x0);
      uVar28 = (ulong)uVar20;
      if ((int)uVar20 < 1) {
        uVar28 = uVar31;
      }
      uVar22 = 0;
      if (0 < (int)uVar21) {
        uVar22 = (ulong)uVar21;
      }
      for (; uVar31 != uVar22; uVar31 = uVar31 + 1) {
        pvVar26 = (void *)((long)local_118.w * uVar31 * local_118.elemsize + (long)local_118.data);
        for (lVar42 = 0; lVar42 < (long)(lVar23 - (ulong)(uVar25 - 1));
            lVar42 = lVar42 + (ulong)uVar25) {
          for (uVar30 = 0; uVar30 != uVar28; uVar30 = uVar30 + 1) {
            for (uVar17 = 0; uVar25 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined1 *)((long)pvVar26 + uVar17) =
                   *(undefined1 *)
                    ((long)m.data +
                    uVar30 + (lVar42 + uVar17) * (long)m.w * m.elemsize +
                             m.cstep * uVar31 * m.elemsize);
            }
            pvVar26 = (void *)((long)pvVar26 + uVar17);
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) goto LAB_001e8048;
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar34 = TILE_N;
    if (TILE_N < 4) {
LAB_001e80ad:
      Mat::create(&this->weight_sgemm_data,TILE_M_2 * iVar34,(iVar44 + iVar34 + -1) / iVar34,
                  (int)((uVar21 - 1) + TILE_M_2) / TILE_M_2,1,1,(Allocator *)0x0);
    }
    else {
      iVar15 = cpu_support_x86_avx512_vnni();
      bVar13 = true;
      if (iVar15 == 0) {
        iVar15 = cpu_support_x86_avx_vnni();
        bVar13 = iVar15 != 0;
      }
      iVar15 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar13 & iVar15 == 0)) goto LAB_001e80ad;
      if (TILE_M_2 < 0x10) {
        if (TILE_M_2 < 8) {
          if (TILE_M_2 < 4) {
            iVar15 = (uint)(1 < TILE_M_2) * 4 + 4;
          }
          else {
            iVar15 = 0x10;
          }
        }
        else {
          iVar15 = 0x20;
        }
      }
      else {
        iVar15 = 0x40;
      }
      Mat::create(&this->weight_sgemm_data,(iVar15 + iVar34) * TILE_M_2,
                  (iVar44 + iVar34 + -1) / iVar34,(int)((uVar21 - 1) + TILE_M_2) / TILE_M_2,1,1,
                  (Allocator *)0x0);
    }
    iVar15 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; iVar15 != iVar14; iVar15 = iVar15 + 1) {
      i_00 = TILE_M_2 * iVar15;
      max_ii = uVar21 - i_00;
      if (TILE_M_2 < (int)(uVar21 - i_00)) {
        max_ii = TILE_M_2;
      }
      for (k_00 = 0; max_kk = iVar44 - k_00, max_kk != 0 && k_00 <= iVar44; k_00 = k_00 + TILE_N) {
        if (iVar34 < max_kk) {
          max_kk = iVar34;
        }
        m.elemsize = (this->weight_sgemm_data).elemsize;
        m.w = (this->weight_sgemm_data).w;
        m.cstep = (size_t)m.w;
        m.elempack = (this->weight_sgemm_data).elempack;
        m.allocator = (this->weight_sgemm_data).allocator;
        m.data = (void *)((long)(this->weight_sgemm_data).data +
                         m.elemsize * m.cstep * (long)(k_00 / iVar34) +
                         (long)(i_00 / TILE_M_2) * (this->weight_sgemm_data).cstep * m.elemsize);
        m.refcount = (int *)0x0;
        m.dims = 2;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        Gemm_x86_avx_utility::pack_A_tile_int8(&local_118,&m,i_00,max_ii,k_00,max_kk);
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar34 = TILE_N;
      }
    }
    piVar11 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar11 == (int *)0x0) goto LAB_001e82ce;
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 != 0) goto LAB_001e82ce;
    if (local_118.allocator != (Allocator *)0x0) {
      (*(local_118.allocator)->_vptr_Allocator[3])();
      goto LAB_001e82ce;
    }
  }
  free(local_118.data);
LAB_001e82ce:
  uVar28 = 0;
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  uVar21 = (this->super_Convolution).num_output;
  pvVar26 = (this->super_Convolution).weight_data_int8_scales.data;
  pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
  pvVar10 = (this->scale_in_data).data;
  uVar31 = 0;
  if (0 < (int)uVar21) {
    uVar31 = (ulong)uVar21;
  }
  for (; uVar31 != uVar28; uVar28 = uVar28 + 1) {
    fVar1 = *(float *)((long)pvVar26 + uVar28 * 4);
    fVar50 = 0.0;
    if (fVar1 != 0.0) {
      fVar50 = 1.0 / (fVar1 * *pfVar9);
    }
    *(float *)((long)pvVar10 + uVar28 * 4) = fVar50;
  }
  if (opt->lightmode != false) {
    piVar11 = (this->super_Convolution).weight_data.refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pAVar12 = (this->super_Convolution).weight_data.allocator;
        if (pAVar12 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar12->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_190->refcount + 4) = 0;
    *(undefined8 *)((long)&local_190->elemsize + 4) = 0;
    local_190->data = (void *)0x0;
    local_190->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}